

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

_Bool init_ucs(unicode_data *ucsdata,char *linecharset,_Bool utf8_override,wchar_t font_charset,
              wchar_t vtmode)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *pcVar3;
  wchar_t local_70;
  wchar_t lineval;
  wchar_t len_1;
  wchar_t wc_1 [1];
  char *p_1;
  wchar_t *pwStack_58;
  char c_1 [1];
  wchar_t *ptr;
  wchar_t len;
  wchar_t wc [1];
  char *p;
  char *pcStack_38;
  char c [1];
  char *s;
  uint local_28;
  _Bool ret;
  wchar_t i;
  wchar_t vtmode_local;
  wchar_t font_charset_local;
  _Bool utf8_override_local;
  char *linecharset_local;
  unicode_data *ucsdata_local;
  
  ucsdata->font_codepage = L'\xffffffff';
  ucsdata->line_codepage = L'\0';
  if (((utf8_override) &&
      ((((pcStack_38 = getenv("LC_ALL"), pcStack_38 != (char *)0x0 && (*pcStack_38 != '\0')) ||
        ((pcStack_38 = getenv("LC_CTYPE"), pcStack_38 != (char *)0x0 && (*pcStack_38 != '\0')))) ||
       ((pcStack_38 = getenv("LANG"), pcStack_38 != (char *)0x0 && (*pcStack_38 != '\0')))))) &&
     (pcVar3 = strstr(pcStack_38,"UTF-8"), pcVar3 != (char *)0x0)) {
    ucsdata->line_codepage = L'7';
  }
  if (ucsdata->line_codepage == L'\0') {
    wVar1 = decode_codepage(linecharset);
    ucsdata->line_codepage = wVar1;
  }
  if (ucsdata->line_codepage == L'\0') {
    ucsdata->line_codepage = font_charset;
  }
  wVar1 = ucsdata->line_codepage;
  for (local_28 = 0; (int)local_28 < 0x100; local_28 = local_28 + 1) {
    p._7_1_ = (undefined1)local_28;
    _len = (char *)((long)&p + 7);
    ptr._0_4_ = 1;
    if (ucsdata->line_codepage == L'\0') {
      ucsdata->unitab_line[(int)local_28] = local_28 | 0xd800;
    }
    else {
      wVar2 = charset_to_unicode((char **)&len,(wchar_t *)&ptr,(wchar_t *)((long)&ptr + 4),L'\x01',
                                 ucsdata->line_codepage,(charset_state *)0x0,anon_var_dwarf_5a72 + 6
                                 ,L'\0');
      if (wVar2 == L'\x01') {
        ucsdata->unitab_line[(int)local_28] = ptr._4_4_;
      }
      else {
        ucsdata->unitab_line[(int)local_28] = L'�';
      }
    }
  }
  for (local_28 = 0; (int)local_28 < 0x100; local_28 = local_28 + 1) {
    if (vtmode == L'\x03') {
      pwStack_58 = L"*#****o~**+++++-----++++|****L. ";
    }
    else {
      pwStack_58 = 
      L"♦▒␉␌␍␊°±␤␋┘┐┌└┼⎺⎻─⎼⎽├┤┴┬│≤≥π≠£· ";
    }
    if (((int)local_28 < 0x5f) || (0x7e < (int)local_28)) {
      ucsdata->unitab_xterm[(int)local_28] = ucsdata->unitab_line[(int)local_28];
    }
    else {
      ucsdata->unitab_xterm[(int)local_28] = pwStack_58[(int)(local_28 & 0x1f)];
    }
  }
  for (local_28 = 0; (int)local_28 < 0x100; local_28 = local_28 + 1) {
    p_1._7_1_ = (undefined1)local_28;
    _len_1 = (char *)((long)&p_1 + 7);
    local_70 = L'\x01';
    wVar2 = charset_to_unicode((char **)&len_1,&local_70,&lineval,L'\x01',L'\x11',
                               (charset_state *)0x0,anon_var_dwarf_5a72 + 6,L'\0');
    if (wVar2 == L'\x01') {
      ucsdata->unitab_scoacs[(int)local_28] = lineval;
    }
    else {
      ucsdata->unitab_scoacs[(int)local_28] = L'�';
    }
  }
  for (local_28 = 0; (int)local_28 < 0x100; local_28 = local_28 + 1) {
    wVar2 = ucsdata->unitab_line[(int)local_28];
    if ((((wVar2 < L' ') || ((L'~' < wVar2 && (wVar2 < L'\xa0')))) ||
        ((L'\xd7ff' < wVar2 && (wVar2 < L'\xd820')))) || (wVar2 == L'\xd87f')) {
      ucsdata->unitab_ctrl[(int)local_28] = (uchar)local_28;
    }
    else {
      ucsdata->unitab_ctrl[(int)local_28] = 0xff;
    }
  }
  return wVar1 == L'\0';
}

Assistant:

bool init_ucs(struct unicode_data *ucsdata, char *linecharset,
              bool utf8_override, int font_charset, int vtmode)
{
    int i;
    bool ret = false;

    /*
     * In the platform-independent parts of the code, font_codepage
     * is used only for system DBCS support - which we don't
     * support at all. So we set this to something which will never
     * be used.
     */
    ucsdata->font_codepage = -1;

    /*
     * If utf8_override is set and the POSIX locale settings
     * dictate a UTF-8 character set, then just go straight for
     * UTF-8.
     */
    ucsdata->line_codepage = CS_NONE;
    if (utf8_override) {
        const char *s;
        if (((s = getenv("LC_ALL"))   && *s) ||
            ((s = getenv("LC_CTYPE")) && *s) ||
            ((s = getenv("LANG"))     && *s)) {
            if (strstr(s, "UTF-8"))
                ucsdata->line_codepage = CS_UTF8;
        }
    }

    /*
     * Failing that, line_codepage should be decoded from the
     * specification in conf.
     */
    if (ucsdata->line_codepage == CS_NONE)
        ucsdata->line_codepage = decode_codepage(linecharset);

    /*
     * If line_codepage is _still_ CS_NONE, we assume we're using
     * the font's own encoding. This has been passed in to us, so
     * we use that. If it's still CS_NONE after _that_ - i.e. the
     * font we were given had an incomprehensible charset - then we
     * fall back to using the D800 page.
     */
    if (ucsdata->line_codepage == CS_NONE)
        ucsdata->line_codepage = font_charset;

    if (ucsdata->line_codepage == CS_NONE)
        ret = true;

    /*
     * Set up unitab_line, by translating each individual character
     * in the line codepage into Unicode.
     */
    for (i = 0; i < 256; i++) {
        char c[1];
        const char *p;
        wchar_t wc[1];
        int len;
        c[0] = i;
        p = c;
        len = 1;
        if (ucsdata->line_codepage == CS_NONE)
            ucsdata->unitab_line[i] = 0xD800 | i;
        else if (1 == charset_to_unicode(&p, &len, wc, 1,
                                         ucsdata->line_codepage,
                                         NULL, L"", 0))
            ucsdata->unitab_line[i] = wc[0];
        else
            ucsdata->unitab_line[i] = 0xFFFD;
    }

    /*
     * Set up unitab_xterm. This is the same as unitab_line except
     * in the line-drawing regions, where it follows the Unicode
     * encoding.
     *
     * (Note that the strange X encoding of line-drawing characters
     * in the bottom 32 glyphs of ISO8859-1 fonts is taken care of
     * by the font encoding, which will spot such a font and act as
     * if it were in a variant encoding of ISO8859-1.)
     */
    for (i = 0; i < 256; i++) {
        static const wchar_t unitab_xterm_std[32] = {
            0x2666, 0x2592, 0x2409, 0x240c, 0x240d, 0x240a, 0x00b0, 0x00b1,
            0x2424, 0x240b, 0x2518, 0x2510, 0x250c, 0x2514, 0x253c, 0x23ba,
            0x23bb, 0x2500, 0x23bc, 0x23bd, 0x251c, 0x2524, 0x2534, 0x252c,
            0x2502, 0x2264, 0x2265, 0x03c0, 0x2260, 0x00a3, 0x00b7, 0x0020
        };
        static const wchar_t unitab_xterm_poorman[32] =
            L"*#****o~**+++++-----++++|****L. ";

        const wchar_t *ptr;

        if (vtmode == VT_POORMAN)
            ptr = unitab_xterm_poorman;
        else
            ptr = unitab_xterm_std;

        if (i >= 0x5F && i < 0x7F)
            ucsdata->unitab_xterm[i] = ptr[i & 0x1F];
        else
            ucsdata->unitab_xterm[i] = ucsdata->unitab_line[i];
    }

    /*
     * Set up unitab_scoacs. The SCO Alternate Character Set is
     * simply CP437.
     */
    for (i = 0; i < 256; i++) {
        char c[1];
        const char *p;
        wchar_t wc[1];
        int len;
        c[0] = i;
        p = c;
        len = 1;
        if (1 == charset_to_unicode(&p, &len, wc, 1, CS_CP437, NULL, L"", 0))
            ucsdata->unitab_scoacs[i] = wc[0];
        else
            ucsdata->unitab_scoacs[i] = 0xFFFD;
    }

    /*
     * Find the control characters in the line codepage. For
     * direct-to-font mode using the D800 hack, we assume 00-1F and
     * 7F are controls, but allow 80-9F through. (It's as good a
     * guess as anything; and my bet is that half the weird fonts
     * used in this way will be IBM or MS code pages anyway.)
     */
    for (i = 0; i < 256; i++) {
        int lineval = ucsdata->unitab_line[i];
        if (lineval < ' ' || (lineval >= 0x7F && lineval < 0xA0) ||
            (lineval >= 0xD800 && lineval < 0xD820) || (lineval == 0xD87F))
            ucsdata->unitab_ctrl[i] = i;
        else
            ucsdata->unitab_ctrl[i] = 0xFF;
    }

    return ret;
}